

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::PluralRules::getRuleFromResource
          (UnicodeString *__return_storage_ptr__,PluralRules *this,Locale *locale,UPluralType type,
          UErrorCode *errCode)

{
  int32_t iVar1;
  UChar *us;
  char *inKey;
  bool bVar2;
  int32_t resLen;
  LocalUResourceBundlePointer setRes;
  LocalUResourceBundlePointer locRes;
  LocalUResourceBundlePointer rb;
  char *key;
  LocalUResourceBundlePointer ruleRes;
  UnicodeString emptyStr;
  UErrorCode status;
  UnicodeString uKey;
  char setKey [256];
  
  emptyStr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  emptyStr.fUnion.fStackFields.fLengthAndFlags = 2;
  if (U_ZERO_ERROR < *errCode) {
    UnicodeString::UnicodeString(__return_storage_ptr__,&emptyStr);
    goto LAB_00271440;
  }
  rb.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)ures_openDirect_63((char *)0x0,"plurals",errCode);
  if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (type == UPLURAL_TYPE_CARDINAL) {
      inKey = "locales";
    }
    else {
      if (type != UPLURAL_TYPE_ORDINAL) {
        *errCode = U_ILLEGAL_ARGUMENT_ERROR;
        goto LAB_002712c9;
      }
      inKey = "locales_ordinals";
    }
    locRes.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)
         ures_getByKey_63((UResourceBundle *)rb.super_LocalPointerBase<UResourceBundle>.ptr,inKey,
                          (UResourceBundle *)0x0,errCode);
    if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
      resLen = 0;
      us = ures_getStringByKey_63
                     ((UResourceBundle *)locRes.super_LocalPointerBase<UResourceBundle>.ptr,
                      locale->fullName,&resLen,errCode);
      if (us == (UChar *)0x0) {
        status = U_ZERO_ERROR;
        strcpy(setKey,locale->fullName);
        while( true ) {
          iVar1 = uloc_getParent_63(setKey,setKey,0x9d,&status);
          if (iVar1 < 1) break;
          resLen = 0;
          us = ures_getStringByKey_63
                         ((UResourceBundle *)locRes.super_LocalPointerBase<UResourceBundle>.ptr,
                          setKey,&resLen,&status);
          if (us != (UChar *)0x0) {
            *errCode = U_ZERO_ERROR;
            goto LAB_002713a5;
          }
          status = U_ZERO_ERROR;
        }
        goto LAB_0027130c;
      }
LAB_002713a5:
      u_UCharsToChars_63(us,setKey,resLen + 1);
      ruleRes.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)
           ures_getByKey_63((UResourceBundle *)rb.super_LocalPointerBase<UResourceBundle>.ptr,
                            "rules",(UResourceBundle *)0x0,errCode);
      if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
        setRes.super_LocalPointerBase<UResourceBundle>.ptr =
             (LocalPointerBase<UResourceBundle>)
             ures_getByKey_63((UResourceBundle *)ruleRes.super_LocalPointerBase<UResourceBundle>.ptr
                              ,setKey,(UResourceBundle *)0x0,errCode);
        if (*errCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar1 = ures_getSize_63((UResourceBundle *)
                                  setRes.super_LocalPointerBase<UResourceBundle>.ptr);
          (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
               (_func_int **)&PTR__UnicodeString_003e4bf0;
          (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
          key = (char *)0x0;
          if (iVar1 < 1) {
            iVar1 = 0;
          }
          while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
            ures_getNextUnicodeString
                      ((UnicodeString *)&status,
                       (UResourceBundle *)setRes.super_LocalPointerBase<UResourceBundle>.ptr,&key,
                       errCode);
            UnicodeString::UnicodeString(&uKey,key,-1,kInvariant);
            UnicodeString::append(__return_storage_ptr__,&uKey);
            UnicodeString::append(__return_storage_ptr__,L':');
            UnicodeString::append(__return_storage_ptr__,(UnicodeString *)&status);
            UnicodeString::append(__return_storage_ptr__,L';');
            UnicodeString::~UnicodeString(&uKey);
            UnicodeString::~UnicodeString((UnicodeString *)&status);
          }
        }
        else {
          UnicodeString::UnicodeString(__return_storage_ptr__,&emptyStr);
        }
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&setRes);
      }
      else {
        UnicodeString::UnicodeString(__return_storage_ptr__,&emptyStr);
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&ruleRes);
    }
    else {
LAB_0027130c:
      UnicodeString::UnicodeString(__return_storage_ptr__,&emptyStr);
    }
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&locRes);
  }
  else {
LAB_002712c9:
    UnicodeString::UnicodeString(__return_storage_ptr__,&emptyStr);
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&rb);
LAB_00271440:
  UnicodeString::~UnicodeString(&emptyStr);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PluralRules::getRuleFromResource(const Locale& locale, UPluralType type, UErrorCode& errCode) {
    UnicodeString emptyStr;

    if (U_FAILURE(errCode)) {
        return emptyStr;
    }
    LocalUResourceBundlePointer rb(ures_openDirect(nullptr, "plurals", &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    const char *typeKey;
    switch (type) {
    case UPLURAL_TYPE_CARDINAL:
        typeKey = "locales";
        break;
    case UPLURAL_TYPE_ORDINAL:
        typeKey = "locales_ordinals";
        break;
    default:
        // Must not occur: The caller should have checked for valid types.
        errCode = U_ILLEGAL_ARGUMENT_ERROR;
        return emptyStr;
    }
    LocalUResourceBundlePointer locRes(ures_getByKey(rb.getAlias(), typeKey, nullptr, &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    int32_t resLen=0;
    const char *curLocaleName=locale.getName();
    const UChar* s = ures_getStringByKey(locRes.getAlias(), curLocaleName, &resLen, &errCode);

    if (s == nullptr) {
        // Check parent locales.
        UErrorCode status = U_ZERO_ERROR;
        char parentLocaleName[ULOC_FULLNAME_CAPACITY];
        const char *curLocaleName2=locale.getName();
        uprv_strcpy(parentLocaleName, curLocaleName2);

        while (uloc_getParent(parentLocaleName, parentLocaleName,
                                       ULOC_FULLNAME_CAPACITY, &status) > 0) {
            resLen=0;
            s = ures_getStringByKey(locRes.getAlias(), parentLocaleName, &resLen, &status);
            if (s != nullptr) {
                errCode = U_ZERO_ERROR;
                break;
            }
            status = U_ZERO_ERROR;
        }
    }
    if (s==nullptr) {
        return emptyStr;
    }

    char setKey[256];
    u_UCharsToChars(s, setKey, resLen + 1);
    // printf("\n PluralRule: %s\n", setKey);

    LocalUResourceBundlePointer ruleRes(ures_getByKey(rb.getAlias(), "rules", nullptr, &errCode));
    if(U_FAILURE(errCode)) {
        return emptyStr;
    }
    LocalUResourceBundlePointer setRes(ures_getByKey(ruleRes.getAlias(), setKey, nullptr, &errCode));
    if (U_FAILURE(errCode)) {
        return emptyStr;
    }

    int32_t numberKeys = ures_getSize(setRes.getAlias());
    UnicodeString result;
    const char *key=nullptr;
    for(int32_t i=0; i<numberKeys; ++i) {   // Keys are zero, one, few, ...
        UnicodeString rules = ures_getNextUnicodeString(setRes.getAlias(), &key, &errCode);
        UnicodeString uKey(key, -1, US_INV);
        result.append(uKey);
        result.append(COLON);
        result.append(rules);
        result.append(SEMI_COLON);
    }
    return result;
}